

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

int __thiscall cmCPackDebGenerator::InitializeInternal(cmCPackDebGenerator *this)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_39;
  cmValue local_38;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CPACK_PACKAGING_INSTALL_PREFIX",(allocator<char> *)&local_38);
  cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_30,"/usr");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CPACK_SET_DESTDIR",&local_39);
  local_38 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_30);
  bVar1 = cmValue::IsOff(&local_38);
  std::__cxx11::string::~string((string *)&local_30);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"CPACK_SET_DESTDIR",(allocator<char> *)&local_38);
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_30,"I_ON");
    std::__cxx11::string::~string((string *)&local_30);
  }
  iVar2 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
  return iVar2;
}

Assistant:

int cmCPackDebGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_PACKAGING_INSTALL_PREFIX", "/usr");
  if (this->GetOption("CPACK_SET_DESTDIR").IsOff()) {
    this->SetOption("CPACK_SET_DESTDIR", "I_ON");
  }
  return this->Superclass::InitializeInternal();
}